

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nullc.cpp
# Opt level: O2

nullres nullcSetGlobal(char *name,void *data)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  void *pvVar5;
  ExternVarInfo *pEVar6;
  ExternTypeInfo *pEVar7;
  uint index;
  undefined1 auVar8 [16];
  
  if (NULLC::initialized == '\0') {
    NULLC::nullcLastError = "ERROR: NULLC is not initialized";
    index = 0;
  }
  else {
    index = 0;
    pvVar5 = nullcGetVariableData((uint *)0x0);
    auVar8._0_4_ = -(uint)(name == (char *)0x0);
    auVar8._4_4_ = -(uint)((int)NULLC::linker == 0 && NULLC::linker._4_4_ == 0);
    auVar8._8_4_ = -(uint)(data == (void *)0x0);
    auVar8._12_4_ = -(uint)((int)pvVar5 == 0 && (int)((ulong)pvVar5 >> 0x20) == 0);
    iVar3 = movmskps((int)pvVar5,auVar8);
    if (iVar3 == 0) {
      uVar4 = NULLC::GetStringHash(name);
      while( true ) {
        uVar1 = *(uint *)(CONCAT44(NULLC::linker._4_4_,(int)NULLC::linker) + 0x23c);
        if (uVar1 <= index) break;
        pEVar6 = FastVector<ExternVarInfo,_false,_false>::operator[]
                           ((FastVector<ExternVarInfo,_false,_false> *)
                            (CONCAT44(NULLC::linker._4_4_,(int)NULLC::linker) + 0x230),index);
        if (pEVar6->nameHash == uVar4) {
          pEVar6 = FastVector<ExternVarInfo,_false,_false>::operator[]
                             ((FastVector<ExternVarInfo,_false,_false> *)
                              (CONCAT44(NULLC::linker._4_4_,(int)NULLC::linker) + 0x230),index);
          uVar4 = pEVar6->offset;
          lVar2 = CONCAT44(NULLC::linker._4_4_,(int)NULLC::linker);
          pEVar6 = FastVector<ExternVarInfo,_false,_false>::operator[]
                             ((FastVector<ExternVarInfo,_false,_false> *)(lVar2 + 0x230),index);
          pEVar7 = FastVector<ExternTypeInfo,_false,_false>::operator[]
                             ((FastVector<ExternTypeInfo,_false,_false> *)(lVar2 + 0x200),
                              pEVar6->type);
          memcpy((void *)((long)pvVar5 + (ulong)uVar4),data,(ulong)pEVar7->size);
          break;
        }
        index = index + 1;
      }
      index = (uint)(index < uVar1);
    }
  }
  return (nullres)index;
}

Assistant:

nullres nullcSetGlobal(const char* name, void* data)
{
	using namespace NULLC;
	NULLC_CHECK_INITIALIZED(false);

	char* mem = (char*)nullcGetVariableData(NULL);
	if(!linker || !name || !data || !mem)
		return 0;
	unsigned hash = GetStringHash(name);
	for(unsigned i = 0; i < linker->exVariables.size(); i++)
	{
		if(linker->exVariables[i].nameHash == hash)
		{
			memcpy(mem + linker->exVariables[i].offset, data, linker->exTypes[linker->exVariables[i].type].size);
			return 1;
		}
	}
	return 0;
}